

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void first_pass_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,MV *ref_mv,FULLPEL_MV *best_mv,int *best_motion_err)

{
  BLOCK_SIZE bsize;
  short sVar1;
  short sVar2;
  int iVar3;
  int stride;
  byte bVar4;
  uint fine_search_interval;
  long lVar5;
  FULLPEL_MV start_mv;
  aom_variance_fn_ptr_t *paVar6;
  aom_variance_fn_ptr_t *paVar7;
  search_site_config *search_sites;
  int iVar8;
  byte bVar9;
  FULLPEL_MV this_best_mv;
  FULLPEL_MV_STATS best_mv_stats;
  aom_variance_fn_ptr_t v_fn_ptr;
  FULLPEL_MOTION_SEARCH_PARAMS ms_params;
  
  bVar9 = 0;
  sVar1 = ref_mv->row;
  sVar2 = ref_mv->col;
  bsize = (*(x->e_mbd).mi)->bsize;
  iVar8 = (cpi->common).width;
  iVar3 = (cpi->common).height;
  if (iVar8 < iVar3) {
    iVar3 = iVar8;
  }
  iVar8 = -1;
  do {
    iVar8 = iVar8 + 1;
    bVar4 = (byte)iVar8 & 0x1f;
  } while (iVar3 << bVar4 < 0x3ff);
  iVar3 = (cpi->sf).fp_sf.reduce_mv_step_param;
  stride = (x->e_mbd).plane[0].pre[0].stride;
  if (stride == (cpi->mv_search_params).search_site_cfg[2][0].stride) {
    search_sites = (cpi->mv_search_params).search_site_cfg[2];
  }
  else {
    search_sites = x->search_site_cfg_buf;
    if (stride != x->search_site_cfg_buf[1].stride) {
      init_motion_compensation_nstep(x->search_site_cfg_buf + 1,stride,0 << bVar4);
    }
  }
  start_mv = (FULLPEL_MV)
             (((int)sVar2 - (~(int)sVar2 >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000 |
             ((int)sVar1 - (~(int)sVar1 >> 0x1f)) + 3U >> 3 & 0xffff);
  if (cpi->is_screen_content_type == 0) {
    fine_search_interval = 0;
  }
  else {
    fine_search_interval = (uint)(cpi->common).features.allow_intrabc;
  }
  av1_make_default_fullpel_ms_params
            (&ms_params,cpi,x,bsize,ref_mv,start_mv,search_sites,'\x01',fine_search_interval);
  iVar8 = av1_full_pixel_search
                    (start_mv,&ms_params,iVar8 + iVar3,(int *)0x0,&this_best_mv,&best_mv_stats,
                     (FULLPEL_MV *)0x0);
  if (iVar8 != 0x7fffffff) {
    paVar6 = cpi->ppi->fn_ptr + bsize;
    paVar7 = &v_fn_ptr;
    for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
      paVar7->sdf = paVar6->sdf;
      paVar6 = (aom_variance_fn_ptr_t *)((long)paVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      paVar7 = (aom_variance_fn_ptr_t *)((long)paVar7 + (ulong)bVar9 * -0x10 + 8);
    }
    iVar8 = av1_get_mvpred_sse(&ms_params.mv_cost_params,this_best_mv,&v_fn_ptr,
                               ms_params.ms_buffers.src,ms_params.ms_buffers.ref);
    if (iVar8 + 0x20 < *best_motion_err) {
      *best_motion_err = iVar8 + 0x20;
      *best_mv = this_best_mv;
    }
  }
  return;
}

Assistant:

static inline void first_pass_motion_search(AV1_COMP *cpi, MACROBLOCK *x,
                                            const MV *ref_mv,
                                            FULLPEL_MV *best_mv,
                                            int *best_motion_err) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  FULLPEL_MV start_mv = get_fullmv_from_mv(ref_mv);
  int tmp_err;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int new_mv_mode_penalty = NEW_MV_MODE_PENALTY;
  const int sr = get_search_range(cm->width, cm->height);
  const int step_param = cpi->sf.fp_sf.reduce_mv_step_param + sr;

  const search_site_config *first_pass_search_sites =
      av1_get_first_pass_search_site_config(cpi, x, NSTEP);
  const int fine_search_interval =
      cpi->is_screen_content_type && cm->features.allow_intrabc;
  FULLPEL_MOTION_SEARCH_PARAMS ms_params;
  av1_make_default_fullpel_ms_params(&ms_params, cpi, x, bsize, ref_mv,
                                     start_mv, first_pass_search_sites, NSTEP,
                                     fine_search_interval);

  FULLPEL_MV this_best_mv;
  FULLPEL_MV_STATS best_mv_stats;
  tmp_err = av1_full_pixel_search(start_mv, &ms_params, step_param, NULL,
                                  &this_best_mv, &best_mv_stats, NULL);

  if (tmp_err < INT_MAX) {
    aom_variance_fn_ptr_t v_fn_ptr = cpi->ppi->fn_ptr[bsize];
    const MSBuffers *ms_buffers = &ms_params.ms_buffers;
    tmp_err = av1_get_mvpred_sse(&ms_params.mv_cost_params, this_best_mv,
                                 &v_fn_ptr, ms_buffers->src, ms_buffers->ref) +
              new_mv_mode_penalty;
  }

  if (tmp_err < *best_motion_err) {
    *best_motion_err = tmp_err;
    *best_mv = this_best_mv;
  }
}